

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instruction.hpp
# Opt level: O3

void __thiscall
InstructionSet::x86::Instruction<true>::Instruction
          (Instruction<true> *this,Operation operation,Source source,Source destination,
          ScaleIndexBase sib,bool lock,AddressSize address_size,Source segment_override,
          DataSize data_size,DisplacementT displacement,ImmediateT operand)

{
  uint uVar1;
  uint uVar2;
  Source SVar3;
  byte bVar4;
  ushort uVar5;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  bool bVar6;
  
  _data_size = (uint)data_size;
  this->operation_ = operation;
  SVar3 = C0;
  if ((int)CONCAT71(in_register_00000011,source) == 0x18) {
    SVar3 = sib.sib_ & BH;
  }
  SVar3 = SVar3 | (operand != 0) << 5 | (displacement != 0) << 6 | address_size << 7 | source;
  uVar1 = (uint)CONCAT71(in_register_00000009,destination);
  uVar2 = (uint)(sib.sib_ & BH);
  if (uVar1 != 0x18) {
    uVar2 = 0;
  }
  this->mem_exts_source_ = SVar3;
  this->extensions_[0] = 0;
  this->extensions_[1] = 0;
  bVar6 = (SVar3 & 0x20) != C0;
  if (bVar6) {
    this->extensions_[0] = operand;
  }
  uVar2 = uVar2 | ((uint)lock << 0xd | _data_size << 0xe) + (sib.sib_ & 0xf8) * 4 | uVar1;
  if ((SVar3 & 0x40) != C0) {
    this->extensions_[bVar6] = displacement;
  }
  if (segment_override == None) {
    if (("\x1f\x1f\x1f\x18"[SVar3 >> 3 & 3] & SVar3) == Indirect) {
      bVar4 = SVar3 << 3;
    }
    else {
      bVar4 = (byte)uVar2;
      uVar5 = 0xc00;
      if (("\x1f\x1f\x1f\x18"[(uVar1 & 0x18) >> 3] & bVar4) != 0x18) goto LAB_001f8384;
      bVar4 = bVar4 * '\b';
    }
    segment_override = (Source)(0x80b0a0a0b0b0b0b >> (bVar4 & 0x3f));
  }
  uVar5 = (ushort)(segment_override & BH) << 10;
LAB_001f8384:
  this->source_data_dest_sib_ = uVar5 | (ushort)uVar2;
  return;
}

Assistant:

constexpr Instruction(
			Operation operation,
			Source source,
			Source destination,
			ScaleIndexBase sib,
			bool lock,
			AddressSize address_size,
			Source segment_override,
			DataSize data_size,
			DisplacementT displacement,
			ImmediateT operand) noexcept :
				operation_(operation),
				mem_exts_source_(uint8_t(
					(int(address_size) << 7) |
					(displacement ? 0x40 : 0x00) |
					(operand ? 0x20 : 0x00) |
					int(source) |
					(source == Source::Indirect ? (uint8_t(sib) & 7) : 0)
				)),
				source_data_dest_sib_(uint16_t(
					(int(data_size) << 14) |
					(lock ? (1 << 13) : 0) |
					((uint8_t(sib) & 0xf8) << 2) |
					int(destination) |
					(destination == Source::Indirect ? (uint8_t(sib) & 7) : 0)
				)) {
			// Decisions on whether to include operand, displacement and/or size extension words
			// have implicitly been made in the int packing above; honour them here.
			int extension = 0;
			if(has_operand()) {
				extensions_[extension] = operand;
				++extension;
			}
			if(has_displacement()) {
				extensions_[extension] = ImmediateT(displacement);
				++extension;
			}

			// Patch in a fully-resolved segment.
			Source segment = segment_override;
			if(segment == Source::None) segment = this->source().default_segment();
			if(segment == Source::None) segment = this->destination().default_segment();
			if(segment == Source::None) segment = Source::DS;
			source_data_dest_sib_ |= (int(segment)&7) << 10;
		}